

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prodcons4.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int *piVar6;
  long lVar7;
  pthread_t *ppVar8;
  int val_mutex;
  int val_empty;
  int val_stored;
  int count_c [100];
  int count_p [100];
  pthread_t tid_consumer [100];
  pthread_t tid_producer [100];
  int local_994;
  int local_990;
  int local_98c;
  int local_988 [100];
  int local_7f8 [100];
  pthread_t local_668 [100];
  pthread_t local_348 [100];
  
  if (argc != 4) {
    main_cold_1();
  }
  nitems = atoi(argv[1]);
  nproducers = atoi(argv[2]);
  nconsumers = atoi(argv[3]);
  uVar1 = _FILE_MODE;
  uVar5 = (ulong)_FILE_MODE;
  shared.mutex = (sem_t *)sem_open("/sem_mutex",0xc0,uVar5,1);
  shared.nempty = (sem_t *)sem_open("/sem_nempty",0xc0,(ulong)uVar1,10);
  shared.nstored = (sem_t *)sem_open("/sem_nstored",0xc0,uVar5,0);
  if (shared.mutex == (sem_t *)0x0) {
    main_cold_2();
  }
  if (shared.nempty == (sem_t *)0x0) {
    main_cold_3();
  }
  if (shared.nstored == (sem_t *)0x0) {
    main_cold_4();
  }
  shared.nput = 0;
  shared.nputval = 0;
  shared.nget = 0;
  shared.ngetval = 0;
  if (0 < nproducers) {
    piVar6 = local_7f8;
    ppVar8 = local_348;
    lVar7 = 0;
    do {
      iVar2 = pthread_create(ppVar8,(pthread_attr_t *)0x0,producer,piVar6);
      if (iVar2 != 0) {
        main_cold_5();
      }
      lVar7 = lVar7 + 1;
      piVar6 = piVar6 + 1;
      ppVar8 = ppVar8 + 1;
    } while (lVar7 < nproducers);
  }
  if (0 < nconsumers) {
    piVar6 = local_988;
    ppVar8 = local_668;
    lVar7 = 0;
    do {
      iVar2 = pthread_create(ppVar8,(pthread_attr_t *)0x0,consumer,piVar6);
      if (iVar2 != 0) {
        main_cold_6();
      }
      lVar7 = lVar7 + 1;
      piVar6 = piVar6 + 1;
      ppVar8 = ppVar8 + 1;
    } while (lVar7 < nconsumers);
  }
  if (nproducers < 1) {
    iVar2 = 0;
  }
  else {
    ppVar8 = local_348;
    lVar7 = 0;
    iVar2 = 0;
    do {
      iVar3 = pthread_join(*ppVar8,(void **)0x0);
      if (iVar3 != 0) {
        main_cold_7();
      }
      iVar2 = iVar2 + local_7f8[lVar7];
      printf("count_p[%d] = %d\n");
      lVar7 = lVar7 + 1;
      ppVar8 = ppVar8 + 1;
    } while (lVar7 < nproducers);
  }
  iVar3 = sem_post((sem_t *)shared.nstored);
  if (iVar3 != 0) {
    main_cold_8();
  }
  if (nconsumers < 1) {
    iVar3 = 0;
  }
  else {
    ppVar8 = local_668;
    lVar7 = 0;
    iVar3 = 0;
    do {
      iVar4 = pthread_join(*ppVar8,(void **)0x0);
      if (iVar4 != 0) {
        main_cold_9();
      }
      iVar3 = iVar3 + local_988[lVar7];
      printf("count_c[%d] = %d\n");
      lVar7 = lVar7 + 1;
      ppVar8 = ppVar8 + 1;
    } while (lVar7 < nconsumers);
  }
  iVar4 = sem_wait((sem_t *)shared.nstored);
  if (iVar4 != 0) {
    main_cold_10();
  }
  local_990 = 0;
  local_98c = 0;
  local_994 = 0;
  iVar4 = sem_getvalue((sem_t *)shared.nstored,&local_98c);
  if (iVar4 != 0) {
    main_cold_11();
  }
  iVar4 = sem_getvalue((sem_t *)shared.nempty,&local_990);
  if (iVar4 != 0) {
    main_cold_12();
  }
  iVar4 = sem_getvalue((sem_t *)shared.mutex,&local_994);
  if (iVar4 != 0) {
    main_cold_13();
  }
  if (((local_990 != 10) || (local_98c != 0)) || (local_994 != 1)) {
    main_cold_14();
  }
  iVar4 = sem_unlink("/sem_mutex");
  if (iVar4 != 0) {
    main_cold_15();
  }
  iVar4 = sem_unlink("/sem_nempty");
  if (iVar4 != 0) {
    main_cold_16();
  }
  iVar4 = sem_unlink("/sem_nstored");
  if (iVar4 != 0) {
    main_cold_17();
  }
  if (iVar2 != nitems) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x5a);
    err_quit("total_p = %d, nitems = %d",iVar2,nitems);
    iVar2 = nitems;
  }
  if (iVar3 != iVar2) {
    main_cold_18();
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  pthread_t tid_producer[MAXTHREADS], tid_consumer[MAXTHREADS];
  int i, count_p[MAXTHREADS], count_c[MAXTHREADS];

  ASSERT_ERR_QUIT(argc == 4, "usage: %s [#items] [#producers] [#consumers]", argv[0]);

  nitems = atoi(argv[1]);
  nproducers = atoi(argv[2]);
  nconsumers = atoi(argv[3]);

  shared.mutex = sem_open(SEM_MUTEX, O_CREAT | O_EXCL, FILE_MODE, 1);
  shared.nempty = sem_open(SEM_NEMPTY, O_CREAT | O_EXCL, FILE_MODE, NBUFF);
  shared.nstored = sem_open(SEM_NSTORED, O_CREAT | O_EXCL, FILE_MODE, 0);

  ASSERT_ERR_QUIT(shared.mutex != SEM_FAILED, "Failed to create semaphore mutex: %d", errno);
  ASSERT_ERR_QUIT(shared.nempty != SEM_FAILED, "Failed to create semaphore nempty: %d", errno);
  ASSERT_ERR_QUIT(shared.nstored != SEM_FAILED, "Failed to create semaphore nstored: %d", errno);

  shared.nput = 0;
  shared.nputval = 0;  
  shared.nget = 0;
  shared.ngetval = 0;

  for (i = 0; i < nproducers; ++i) {
    ASSERT_ERR_QUIT(pthread_create(&tid_producer[i], NULL, &producer, &count_p[i]) == 0, 
      "Failed to create producer thread");
  }
  for (i = 0; i < nconsumers; ++i) {
    ASSERT_ERR_QUIT(pthread_create(&tid_consumer[i], NULL, &consumer, &count_c[i]) == 0,
      "Failed to create consumer thread");
  }
  int total_p = 0, total_c = 0;

  for (i = 0; i < nproducers; ++i) {
    ASSERT_ERR_QUIT(pthread_join(tid_producer[i], NULL) == 0, 
      "Failed to join producer thread: %ld", tid_producer[i]);
    total_p += count_p[i];
    printf("count_p[%d] = %d\n", i, count_p[i]);
  }
  ASSERT_ERR_QUIT(sem_post(shared.nstored) == 0, "Failed to post to nstored");
  for (i = 0; i < nconsumers; ++i) {
    ASSERT_ERR_QUIT(pthread_join(tid_consumer[i], NULL) == 0, 
      "Failed to join consumer thread: %ld", tid_consumer[i]);
    total_c += count_c[i];
    printf("count_c[%d] = %d\n", i, count_c[i]);
  }
  ASSERT_ERR_QUIT(sem_wait(shared.nstored) == 0, "Failed to wait for nstored");

#if __linux__
  int val_empty = 0, val_stored = 0, val_mutex = 0;
  ASSERT_ERR_SYS(sem_getvalue(shared.nstored, &val_stored) == 0, "Failed to get value of nstored");
  ASSERT_ERR_SYS(sem_getvalue(shared.nempty, &val_empty) == 0, "Failed to get value of nempty");
  ASSERT_ERR_SYS(sem_getvalue(shared.mutex, &val_mutex) == 0, "Failed to get value of stored");

  ASSERT_ERR_SYS(val_empty == NBUFF && val_stored == 0 && val_mutex == 1, 
    "logic error: empty = %d, stored = %d, mutex = %d", val_empty, val_stored, val_mutex);
#endif

  ASSERT_ERR_QUIT(0 == sem_unlink(SEM_MUTEX), "Failed to unlink semaphore mutex");
  ASSERT_ERR_QUIT(0 == sem_unlink(SEM_NEMPTY), "Failed to unlink semaphore nempty");
  ASSERT_ERR_QUIT(0 == sem_unlink(SEM_NSTORED), "Failed to unlink semaphore nstored");

  ASSERT_ERR_QUIT(total_p == nitems, "total_p = %d, nitems = %d", total_p, nitems);
  ASSERT_ERR_QUIT(total_c == nitems, "total_c = %d, nitems = %d", total_c, nitems);
  return 0;
}